

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_DeclarationBinder.cpp
# Opt level: O3

void __thiscall
psy::C::DeclarationBinder::DiagnosticsReporter::FunctionReturningArray
          (DiagnosticsReporter *this,SyntaxToken *decltorTk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  long *local_170;
  long local_160;
  long lStack_158;
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  DiagnosticDescriptor local_f0;
  string local_88;
  SyntaxToken local_68;
  
  SyntaxToken::valueText_abi_cxx11_(&local_88,decltorTk);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x45a4e1);
  paVar1 = &local_f0.id_.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_f0.id_.field_2._M_allocated_capacity = *psVar4;
    local_f0.id_.field_2._8_8_ = plVar3[3];
    local_f0.id_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.id_.field_2._M_allocated_capacity = *psVar4;
    local_f0.id_._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f0.id_._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_160 = *plVar5;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar5;
    local_170 = (long *)*plVar3;
  }
  lVar2 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.id_._M_dataplus._M_p,local_f0.id_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,ID_of_FunctionReturningArray_abi_cxx11_._M_dataplus._M_p,
             ID_of_FunctionReturningArray_abi_cxx11_._M_dataplus._M_p +
             ID_of_FunctionReturningArray_abi_cxx11_._M_string_length);
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"[[function returning array]]","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char*>((string *)local_130,local_170,lVar2 + (long)local_170);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_f0,local_150,local_110,local_130,2,2);
  local_68.field_10 = decltorTk->field_10;
  local_68.tree_ = decltorTk->tree_;
  local_68.syntaxK_ = decltorTk->syntaxK_;
  local_68.byteSize_ = decltorTk->byteSize_;
  local_68.charSize_ = decltorTk->charSize_;
  local_68._14_2_ = *(undefined2 *)&decltorTk->field_0xe;
  local_68.byteOffset_ = decltorTk->byteOffset_;
  local_68.charOffset_ = decltorTk->charOffset_;
  local_68.matchingBracket_ = decltorTk->matchingBracket_;
  local_68.field_7 = decltorTk->field_7;
  local_68._34_2_ = *(undefined2 *)&decltorTk->field_0x22;
  local_68.lineno_ = decltorTk->lineno_;
  local_68.column_ = decltorTk->column_;
  local_68._44_4_ = *(undefined4 *)&decltorTk->field_0x2c;
  diagnose(this,&local_f0,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.description_._M_dataplus._M_p != &local_f0.description_.field_2) {
    operator_delete(local_f0.description_._M_dataplus._M_p,
                    local_f0.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.title_._M_dataplus._M_p != &local_f0.title_.field_2) {
    operator_delete(local_f0.title_._M_dataplus._M_p,
                    local_f0.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.id_._M_dataplus._M_p,local_f0.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  return;
}

Assistant:

void DeclarationBinder::DiagnosticsReporter::FunctionReturningArray(SyntaxToken decltorTk)
{
    auto s = "`"
            + decltorTk.valueText()
            + "' declared as function returning an array";

    diagnose(DiagnosticDescriptor(
                 ID_of_FunctionReturningArray,
                 "[[function returning array]]",
                 s,
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::Binding),
             decltorTk);
}